

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O2

int32_t icu_63::number::impl::NumberFormatterImpl::formatStatic
                  (MacroProps *macros,DecimalQuantity *inValue,NumberStringBuilder *outString,
                  UErrorCode *status)

{
  int32_t end;
  int32_t iVar1;
  MicroProps *micros;
  NumberFormatterImpl impl;
  NumberFormatterImpl local_240;
  
  iVar1 = 0;
  NumberFormatterImpl(&local_240,macros,false,status);
  micros = preProcessUnsafe(&local_240,inValue,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    end = writeNumber(micros,inValue,outString,0,status);
    iVar1 = writeAffixes(micros,outString,0,end,status);
    iVar1 = iVar1 + end;
  }
  ~NumberFormatterImpl(&local_240);
  return iVar1;
}

Assistant:

int32_t NumberFormatterImpl::formatStatic(const MacroProps& macros, DecimalQuantity& inValue,
                                       NumberStringBuilder& outString, UErrorCode& status) {
    NumberFormatterImpl impl(macros, false, status);
    MicroProps& micros = impl.preProcessUnsafe(inValue, status);
    if (U_FAILURE(status)) { return 0; }
    int32_t length = writeNumber(micros, inValue, outString, 0, status);
    length += writeAffixes(micros, outString, 0, length, status);
    return length;
}